

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

void print_version(void)

{
  fputs("LuaJIT 2.0.4 -- Copyright (C) 2005-2015 Mike Pall. http://luajit.org/\n",_stdout);
  fputs("\n",_stdout);
  fputs(" _____              _     \n",_stdout);
  fputs("|_   _|            | |    \n",_stdout);
  fputs("  | | ___  _ __ ___| |__  \n",_stdout);
  fputs("  | |/ _ \\| \'__/ __| \'_ \\ \n",_stdout);
  fputs("  | | (_) | | | (__| | | |\n",_stdout);
  fputs("  \\_/\\___/|_|  \\___|_| |_|\n",_stdout);
  fputs("\n",_stdout);
  return;
}

Assistant:

static void print_version(void)
{
  fputs(LUAJIT_VERSION " -- " LUAJIT_COPYRIGHT ". " LUAJIT_URL "\n", stdout);
  fputs("\n", stdout);
  fputs(" _____              _     \n", stdout);
  fputs("|_   _|            | |    \n", stdout);
  fputs("  | | ___  _ __ ___| |__  \n", stdout);
  fputs("  | |/ _ \\| '__/ __| '_ \\ \n", stdout);
  fputs("  | | (_) | | | (__| | | |\n", stdout);
  fputs("  \\_/\\___/|_|  \\___|_| |_|\n", stdout);
  fputs("\n", stdout);
}